

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O1

uc_err uc_context_restore(uc_engine *uc,uc_context *context)

{
  int iVar1;
  MemoryRegion *pMVar2;
  uint64_t address;
  bool bVar3;
  Int128 IVar4;
  uc_err uVar5;
  uint uVar6;
  MemoryRegion *pMVar7;
  ulong uVar8;
  
  if ((uc->init_done != false) || (uVar5 = uc_init_engine(uc), uVar5 == UC_ERR_OK)) {
    if ((uc->context_content & UC_CTL_CONTEXT_MEMORY) != 0) {
      uc->snapshot_level = context->snapshot_level;
      pMVar2 = (uc->system_memory->subregions).tqh_first;
      while (pMVar7 = pMVar2, pMVar7 != (MemoryRegion *)0x0) {
        pMVar2 = (pMVar7->subregions_link).tqe_next;
        (*uc->memory_filter_subregions)(pMVar7,uc->snapshot_level);
        if ((pMVar7->subregions).tqh_first == (MemoryRegion *)0x0) {
          (*uc->memory_unmap)(uc,pMVar7);
        }
      }
      for (uVar8 = (ulong)uc->unmapped_regions->len; uVar8 != 0; uVar8 = uVar8 - 1) {
        pMVar2 = *(MemoryRegion **)(uc->unmapped_regions->data + uVar8 * 8 + -8);
        pMVar7 = (pMVar2->subregions).tqh_first;
        if ((pMVar2->subregions).tqh_first == (MemoryRegion *)0x0) {
          pMVar7 = pMVar2;
        }
        iVar1 = *(int *)&pMVar2->container;
        pMVar2->container = (MemoryRegion *)0x0;
        if (iVar1 < uc->snapshot_level) break;
        if (*(long *)((long)&pMVar2->size + 8) != 0) {
          __assert_fail("r == a",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                        ,0x16,"uint64_t int128_get64(Int128)");
        }
        IVar4 = pMVar2->size;
        address = pMVar2->addr;
        uVar6 = bsearch_mapped_blocks(uc,address);
        if ((uVar6 < uc->mapped_block_count) &&
           (uc->mapped_blocks[uVar6]->addr <= ((long)IVar4 + address) - 1)) {
          uVar5 = UC_ERR_MAP;
          bVar3 = false;
          goto LAB_004d5adc;
        }
        (*uc->memory_movein)(uc,pMVar2);
        (*uc->memory_filter_subregions)(pMVar2,uc->snapshot_level);
        if ((pMVar7 != pMVar2) && ((pMVar2->subregions).tqh_first == (MemoryRegion *)0x0)) {
          (*uc->memory_unmap)(uc,(MemoryRegion *)0x0);
        }
        mem_map(uc,pMVar7);
        g_array_remove_range(uc->unmapped_regions,(int)uVar8 - 1,1);
      }
      uc->snapshot_level = uc->snapshot_level + -1;
      uVar5 = UC_ERR_OK;
      bVar3 = true;
LAB_004d5adc:
      if (!bVar3) {
        return uVar5;
      }
      if (uc->snapshot_level != 0x7fffffff) {
        uc->snapshot_level = uc->snapshot_level + 1;
      }
    }
    uVar5 = UC_ERR_OK;
    if ((uc->context_content & UC_CTL_CONTEXT_CPU) != 0) {
      if (uc->context_restore != (uc_context_restore_t)0x0) {
        uVar5 = (*uc->context_restore)(uc,context);
        return uVar5;
      }
      memcpy(uc->cpu->env_ptr,&context->field_0x14,context->context_size);
    }
  }
  return uVar5;
}

Assistant:

UNICORN_EXPORT
uc_err uc_context_restore(uc_engine *uc, uc_context *context)
{
    UC_INIT(uc);
    uc_err ret;

    if (uc->context_content & UC_CTL_CONTEXT_MEMORY) {
        uc->snapshot_level = context->snapshot_level;
        ret = uc_restore_latest_snapshot(uc);
        if (ret != UC_ERR_OK) {
            return ret;
        }
        uc_snapshot(uc);
    }

    if (uc->context_content & UC_CTL_CONTEXT_CPU) {
        if (!uc->context_restore) {
            memcpy(uc->cpu->env_ptr, context->data, context->context_size);
            return UC_ERR_OK;
        } else {
            return uc->context_restore(uc, context);
        }
    }
    return UC_ERR_OK;
}